

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O3

bool __thiscall cmListFile::ParseFile(cmListFile *this,char *filename,bool topLevel,cmMakefile *mf)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  undefined4 uVar3;
  int iVar4;
  undefined7 extraout_var;
  pointer pcVar5;
  iterator iVar6;
  pointer s;
  string name;
  cmListFileParser parser;
  value_type local_118;
  undefined4 local_e4;
  cmMakefile *local_e0;
  undefined1 local_d8 [8];
  undefined1 local_d0 [8];
  cmListFile local_c8;
  size_type local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  _Alloc_hider local_98;
  undefined1 auStack_90 [24];
  long local_78;
  pointer pcStack_70;
  pointer local_68;
  pointer pcStack_60;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  bVar2 = cmsys::SystemTools::FileExists(filename);
  if (bVar2) {
    std::__cxx11::string::string((string *)local_d8,filename,(allocator *)&local_118);
    bVar2 = cmsys::SystemTools::FileIsDirectory((string *)local_d8);
    if (local_d8 != (undefined1  [8])&local_c8) {
      operator_delete((void *)local_d8,
                      (long)local_c8.Functions.
                            super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                            ._M_impl.super__Vector_impl_data._M_start + 1);
    }
    if (!bVar2) {
      local_d8 = (undefined1  [8])this;
      local_d0 = (undefined1  [8])mf;
      local_c8.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)filename;
      local_c8.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)cmListFileLexer_New();
      local_b0 = 0;
      local_a8._M_local_buf[0] = '\0';
      local_98._M_p = auStack_90 + 8;
      auStack_90._0_8_ = (pointer)0x0;
      auStack_90._8_8_ = auStack_90._8_8_ & 0xffffffffffffff00;
      local_78 = 0;
      pcStack_70 = (pointer)0x0;
      local_68 = (pointer)0x0;
      pcStack_60 = (pointer)0x0;
      local_c8.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&local_a8;
      bVar2 = cmListFileParser::ParseFile((cmListFileParser *)local_d8);
      uVar3 = (undefined4)CONCAT71(extraout_var,bVar2);
      cmListFileParser::~cmListFileParser((cmListFileParser *)local_d8);
      local_e4 = uVar3;
      if (topLevel) {
        pcVar5 = (this->Functions).
                 super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl
                 .super__Vector_impl_data._M_start;
        s = pcVar5;
        local_e0 = mf;
        if (pcVar5 != (this->Functions).
                      super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                      _M_impl.super__Vector_impl_data._M_finish) {
          do {
            cmsys::SystemTools::LowerCase((string *)local_d8,(string *)s);
            iVar4 = std::__cxx11::string::compare((char *)local_d8);
            if (local_d8 != (undefined1  [8])&local_c8) {
              operator_delete((void *)local_d8,
                              (ulong)((long)local_c8.Functions.
                                            super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                            ._M_impl.super__Vector_impl_data._M_start + 1));
            }
            if (iVar4 == 0) goto LAB_003a9cf6;
            s = s + 1;
          } while (s != (this->Functions).
                        super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                        _M_impl.super__Vector_impl_data._M_finish);
          pcVar5 = (this->Functions).
                   super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        }
        if ((ulong)(((long)s - (long)pcVar5 >> 5) * -0x5555555555555555) < 0x1e) {
          local_c8.Functions.
          super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)local_d0;
          local_d0 = (undefined1  [8])((ulong)local_d0 & 0xffffffff00000000);
          local_c8.Functions.
          super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_b0 = 0;
          paVar1 = &local_118.Value.field_2;
          local_118.Value._M_dataplus._M_p = (pointer)paVar1;
          local_c8.Functions.
          super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               local_c8.Functions.
               super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
               super__Vector_impl_data._M_finish;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"project","");
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)local_d8,&local_118.Value);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118.Value._M_dataplus._M_p != paVar1) {
            operator_delete(local_118.Value._M_dataplus._M_p,
                            local_118.Value.field_2._M_allocated_capacity + 1);
          }
          local_118.Value._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"set","");
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)local_d8,&local_118.Value);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118.Value._M_dataplus._M_p != paVar1) {
            operator_delete(local_118.Value._M_dataplus._M_p,
                            local_118.Value.field_2._M_allocated_capacity + 1);
          }
          local_118.Value._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"if","");
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)local_d8,&local_118.Value);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118.Value._M_dataplus._M_p != paVar1) {
            operator_delete(local_118.Value._M_dataplus._M_p,
                            local_118.Value.field_2._M_allocated_capacity + 1);
          }
          local_118.Value._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"endif","");
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)local_d8,&local_118.Value);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118.Value._M_dataplus._M_p != paVar1) {
            operator_delete(local_118.Value._M_dataplus._M_p,
                            local_118.Value.field_2._M_allocated_capacity + 1);
          }
          local_118.Value._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"else","");
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)local_d8,&local_118.Value);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118.Value._M_dataplus._M_p != paVar1) {
            operator_delete(local_118.Value._M_dataplus._M_p,
                            local_118.Value.field_2._M_allocated_capacity + 1);
          }
          local_118.Value._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"elseif","");
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)local_d8,&local_118.Value);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118.Value._M_dataplus._M_p != paVar1) {
            operator_delete(local_118.Value._M_dataplus._M_p,
                            local_118.Value.field_2._M_allocated_capacity + 1);
          }
          local_118.Value._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"add_executable","");
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)local_d8,&local_118.Value);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118.Value._M_dataplus._M_p != paVar1) {
            operator_delete(local_118.Value._M_dataplus._M_p,
                            local_118.Value.field_2._M_allocated_capacity + 1);
          }
          local_118.Value._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"add_library","");
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)local_d8,&local_118.Value);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118.Value._M_dataplus._M_p != paVar1) {
            operator_delete(local_118.Value._M_dataplus._M_p,
                            local_118.Value.field_2._M_allocated_capacity + 1);
          }
          local_118.Value._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_118,"target_link_libraries","");
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)local_d8,&local_118.Value);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118.Value._M_dataplus._M_p != paVar1) {
            operator_delete(local_118.Value._M_dataplus._M_p,
                            local_118.Value.field_2._M_allocated_capacity + 1);
          }
          local_118.Value._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"option","");
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)local_d8,&local_118.Value);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118.Value._M_dataplus._M_p != paVar1) {
            operator_delete(local_118.Value._M_dataplus._M_p,
                            local_118.Value.field_2._M_allocated_capacity + 1);
          }
          local_118.Value._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"message","");
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)local_d8,&local_118.Value);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118.Value._M_dataplus._M_p != paVar1) {
            operator_delete(local_118.Value._M_dataplus._M_p,
                            local_118.Value.field_2._M_allocated_capacity + 1);
          }
          pcVar5 = (this->Functions).
                   super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if (pcVar5 != (this->Functions).
                        super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                        _M_impl.super__Vector_impl_data._M_finish) {
            do {
              cmsys::SystemTools::LowerCase(&local_118.Value,(string *)pcVar5);
              iVar6 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_d8,&local_118.Value);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_118.Value._M_dataplus._M_p != paVar1) {
                operator_delete(local_118.Value._M_dataplus._M_p,
                                local_118.Value.field_2._M_allocated_capacity + 1);
              }
              if (iVar6._M_node == (_Base_ptr)local_d0) {
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_d8);
                goto LAB_003a9cdf;
              }
              pcVar5 = pcVar5 + 1;
            } while (pcVar5 != (this->Functions).
                               super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                               ._M_impl.super__Vector_impl_data._M_finish);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_d8);
        }
        else {
LAB_003a9cdf:
          local_e0->CheckCMP0000 = true;
          cmMakefile::SetPolicyVersion(local_e0,"2.4");
        }
LAB_003a9cf6:
        pcVar5 = (this->Functions).
                 super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl
                 .super__Vector_impl_data._M_start;
        if (pcVar5 != (this->Functions).
                      super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                      _M_impl.super__Vector_impl_data._M_finish) {
          do {
            cmsys::SystemTools::LowerCase((string *)local_d8,(string *)pcVar5);
            iVar4 = std::__cxx11::string::compare((char *)local_d8);
            if (local_d8 != (undefined1  [8])&local_c8) {
              operator_delete((void *)local_d8,
                              (ulong)((long)local_c8.Functions.
                                            super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                            ._M_impl.super__Vector_impl_data._M_start + 1));
            }
            if (iVar4 == 0) goto LAB_003a98b1;
            pcVar5 = pcVar5 + 1;
          } while (pcVar5 != (this->Functions).
                             super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
        }
        local_d8 = (undefined1  [8])&local_c8;
        local_d0 = (undefined1  [8])0x0;
        local_c8.Functions.
        super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)((ulong)local_c8.Functions.
                              super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                              ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffffff00);
        local_c8.Functions.
        super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)&local_a8;
        local_b0 = 0;
        local_a8._M_local_buf[0] = '\0';
        local_98._M_p = (pointer)0x0;
        auStack_90._0_8_ = (pointer)0x0;
        auStack_90._8_8_ = 0;
        auStack_90._16_8_ = 0;
        std::__cxx11::string::_M_replace((ulong)local_d8,0,(char *)0x0,0x4c899f);
        local_50 = local_40;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Project","");
        paVar1 = &local_118.Value.field_2;
        local_118.Value._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_118,local_50,local_48 + (long)local_50);
        local_118.Delim = Unquoted;
        local_118.Line = 0;
        if (local_50 != local_40) {
          operator_delete(local_50,local_40[0] + 1);
        }
        std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::push_back
                  ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)auStack_90,
                   &local_118);
        std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::insert
                  (&this->Functions,
                   (this->Functions).
                   super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                   _M_impl.super__Vector_impl_data._M_start,(value_type *)local_d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118.Value._M_dataplus._M_p != paVar1) {
          operator_delete(local_118.Value._M_dataplus._M_p,
                          local_118.Value.field_2._M_allocated_capacity + 1);
        }
        std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector
                  ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)auStack_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8.Functions.
               super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage != &local_a8) {
          operator_delete(local_c8.Functions.
                          super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          CONCAT71(local_a8._M_allocated_capacity._1_7_,local_a8._M_local_buf[0]) +
                          1);
        }
        uVar3 = local_e4;
        local_e4 = uVar3;
        if (local_d8 != (undefined1  [8])&local_c8) {
          operator_delete((void *)local_d8,
                          (long)local_c8.Functions.
                                super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                ._M_impl.super__Vector_impl_data._M_start + 1);
          local_e4 = uVar3;
        }
      }
      goto LAB_003a98b1;
    }
  }
  local_e4 = 0;
LAB_003a98b1:
  return SUB41(local_e4,0);
}

Assistant:

bool cmListFile::ParseFile(const char* filename,
                           bool topLevel,
                           cmMakefile *mf)
{
  if(!cmSystemTools::FileExists(filename) ||
     cmSystemTools::FileIsDirectory(filename))
    {
    return false;
    }

  bool parseError = false;

  {
  cmListFileParser parser(this, mf, filename);
  parseError = !parser.ParseFile();
  }

  // do we need a cmake_policy(VERSION call?
  if(topLevel)
  {
    bool hasVersion = false;
    // search for the right policy command
    for(std::vector<cmListFileFunction>::iterator i
          = this->Functions.begin();
        i != this->Functions.end(); ++i)
    {
      if (cmSystemTools::LowerCase(i->Name) == "cmake_minimum_required")
      {
        hasVersion = true;
        break;
      }
    }
    // if no policy command is found this is an error if they use any
    // non advanced functions or a lot of functions
    if(!hasVersion)
    {
      bool isProblem = true;
      if (this->Functions.size() < 30)
      {
        // the list of simple commands DO NOT ADD TO THIS LIST!!!!!
        // these commands must have backwards compatibility forever and
        // and that is a lot longer than your tiny mind can comprehend mortal
        std::set<std::string> allowedCommands;
        allowedCommands.insert("project");
        allowedCommands.insert("set");
        allowedCommands.insert("if");
        allowedCommands.insert("endif");
        allowedCommands.insert("else");
        allowedCommands.insert("elseif");
        allowedCommands.insert("add_executable");
        allowedCommands.insert("add_library");
        allowedCommands.insert("target_link_libraries");
        allowedCommands.insert("option");
        allowedCommands.insert("message");
        isProblem = false;
        for(std::vector<cmListFileFunction>::iterator i
              = this->Functions.begin();
            i != this->Functions.end(); ++i)
        {
          std::string name = cmSystemTools::LowerCase(i->Name);
          if (allowedCommands.find(name) == allowedCommands.end())
          {
            isProblem = true;
            break;
          }
        }
      }

      if (isProblem)
      {
      // Tell the top level cmMakefile to diagnose
      // this violation of CMP0000.
      mf->SetCheckCMP0000(true);

      // Implicitly set the version for the user.
      mf->SetPolicyVersion("2.4");
      }
    }
  }

  if(topLevel)
    {
    bool hasProject = false;
    // search for a project command
    for(std::vector<cmListFileFunction>::iterator i
          = this->Functions.begin();
        i != this->Functions.end(); ++i)
      {
      if(cmSystemTools::LowerCase(i->Name) == "project")
        {
        hasProject = true;
        break;
        }
      }
    // if no project command is found, add one
    if(!hasProject)
      {
      cmListFileFunction project;
      project.Name = "PROJECT";
      cmListFileArgument prj("Project", cmListFileArgument::Unquoted, 0);
      project.Arguments.push_back(prj);
      this->Functions.insert(this->Functions.begin(),project);
      }
    }
  if(parseError)
    {
    return false;
    }
  return true;
}